

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int coda_cursor_read_int16_array
              (coda_cursor_conflict *cursor,int16_t *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  coda_type *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *message;
  coda_native_type native_type;
  long in_FS_OFFSET;
  long num_elements;
  long local_20;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (pcVar2 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar2 == (coda_type *)0x0)) {
    pcVar3 = "invalid cursor argument (%s:%u)";
    uVar4 = 0xbd6;
  }
  else {
    if (dst != (int16_t *)0x0) {
      if (99 < pcVar2->format) {
        pcVar2 = *(coda_type **)&pcVar2->type_class;
      }
      if (pcVar2->type_class == coda_array_class) {
        pcVar2 = *(coda_type **)(pcVar2 + 1);
        if (((pcVar2->type_class != coda_integer_class) && (pcVar2->type_class != coda_real_class))
           || ((*(int *)(in_FS_OFFSET + -0x1204) == 0 ||
               (native_type = coda_native_type_double, pcVar2[1].name == (char *)0x0)))) {
          native_type = pcVar2->read_type;
        }
        if (native_type == coda_native_type_int16) {
          iVar1 = read_int16_array(cursor,dst,array_ordering);
          if (iVar1 == 0) {
            return 0;
          }
          return -1;
        }
        if (native_type == coda_native_type_uint8) {
          iVar1 = read_uint8_array(cursor,(uint8_t *)dst,array_ordering);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_get_num_elements(cursor,&local_20);
          if (iVar1 == 0) {
            if (local_20 < 1) {
              return 0;
            }
            local_20 = local_20 + 1;
            do {
              dst[local_20 + -2] = (ushort)*(byte *)((long)dst + local_20 + -2);
              local_20 = local_20 + -1;
            } while (1 < local_20);
            return 0;
          }
          return -1;
        }
        if (native_type == coda_native_type_int8) {
          iVar1 = read_int8_array(cursor,(int8_t *)dst,array_ordering);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_get_num_elements(cursor,&local_20);
          if (iVar1 == 0) {
            if (local_20 < 1) {
              return 0;
            }
            local_20 = local_20 + 1;
            do {
              dst[local_20 + -2] = (short)*(char *)((long)dst + local_20 + -2);
              local_20 = local_20 + -1;
            } while (1 < local_20);
            return 0;
          }
          return -1;
        }
        pcVar3 = coda_type_get_native_type_name(native_type);
        message = "can not read %s data using a int16 data type";
      }
      else {
        pcVar3 = coda_type_get_class_name(pcVar2->type_class);
        message = "cursor does not refer to an array (current type is %s)";
      }
      coda_set_error(-0x69,message,pcVar3);
      return -1;
    }
    pcVar3 = "dst argument is NULL (%s:%u)";
    uVar4 = 0xbdb;
  }
  coda_set_error(-100,pcVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_int16_array(const coda_cursor *cursor, int16_t *dst,
                                             coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;
    long num_elements;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_array(cursor, (int8_t *)dst, array_ordering) != 0)
            {
                return -1;
            }
            if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
            {
                return -1;
            }
            for (i = num_elements - 1; i >= 0; i--)
            {
                dst[i] = (int16_t)((int8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint8:
            if (read_uint8_array(cursor, (uint8_t *)dst, array_ordering) != 0)
            {
                return -1;
            }
            if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
            {
                return -1;
            }
            for (i = num_elements - 1; i >= 0; i--)
            {
                dst[i] = (int16_t)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_int16:
            if (read_int16_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int16 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}